

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::ConstructorCommon
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,HeapBucket *bucket,
          ushort objectSize,ushort objectCount,HeapBlockType heapBlockType)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  this->heapBucket = bucket;
  Init(this,objectSize,objectCount);
  if (MediumFinalizableBlockWithBarrierType < heapBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x66,
                       "(heapBlockType < HeapBlock::HeapBlockType::SmallAllocBlockTypeCount + HeapBlock::HeapBlockType::MediumAllocBlockTypeCount)"
                       ,
                       "heapBlockType < HeapBlock::HeapBlockType::SmallAllocBlockTypeCount + HeapBlock::HeapBlockType::MediumAllocBlockTypeCount"
                      );
    if (!bVar3) goto LAB_006b3f7b;
    *puVar4 = 0;
  }
  if ((objectCount < 2) || (0x1000 / objectSize != objectCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x67,
                       "(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize)"
                       ,
                       "objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize"
                      );
    if (!bVar3) goto LAB_006b3f7b;
    *puVar4 = 0;
  }
  psVar1 = this->heapBucket->heapInfo->heapBlockCount + heapBlockType;
  *psVar1 = *psVar1 + 1;
  if (MediumAllocBlockTypeCount < heapBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x6f,"(heapBlockType < HeapBlockType::SmallAllocBlockTypeCount)",
                       "heapBlockType < HeapBlockType::SmallAllocBlockTypeCount");
    if (!bVar3) {
LAB_006b3f7b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->lastUncollectedAllocBytes = 0;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::ConstructorCommon(HeapBucket * bucket, ushort objectSize, ushort objectCount, HeapBlockType heapBlockType)
{
    this->heapBucket = bucket;
    this->Init(objectSize, objectCount);
    Assert(heapBlockType < HeapBlock::HeapBlockType::SmallAllocBlockTypeCount + HeapBlock::HeapBlockType::MediumAllocBlockTypeCount);
    Assert(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize);

#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    heapBucket->heapInfo->heapBlockCount[heapBlockType]++;
#endif

    if (TBlockAttributes::IsSmallBlock)
    {
        Assert(heapBlockType < HeapBlockType::SmallAllocBlockTypeCount);
    }
    else
    {
        Assert(heapBlockType >= HeapBlockType::SmallAllocBlockTypeCount && heapBlockType < HeapBlockType::SmallBlockTypeCount);
    }

    DebugOnly(lastUncollectedAllocBytes = 0);
}